

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

int __thiscall asmjit::_abi_1_10::Zone::dup(Zone *this,int __fd)

{
  byte in_CL;
  size_t in_RDX;
  undefined4 in_register_00000034;
  uint8_t *m;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  size_t in_stack_ffffffffffffffb8;
  uchar *local_8;
  
  if ((void *)CONCAT44(in_register_00000034,__fd) == (void *)0x0 || in_RDX == 0) {
    local_8 = (uchar *)0x0;
  }
  else {
    if (in_RDX == 0xffffffffffffffff) {
      DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
    }
    local_8 = allocT<unsigned_char>(this,in_stack_ffffffffffffffb8,0x15292d);
    if (local_8 == (uchar *)0x0) {
      local_8 = (uchar *)0x0;
    }
    else {
      memcpy(local_8,(void *)CONCAT44(in_register_00000034,__fd),in_RDX);
      if ((in_CL & 1) != 0) {
        local_8[in_RDX] = '\0';
      }
    }
  }
  return (int)local_8;
}

Assistant:

void* Zone::dup(const void* data, size_t size, bool nullTerminate) noexcept {
  if (ASMJIT_UNLIKELY(!data || !size))
    return nullptr;

  ASMJIT_ASSERT(size != SIZE_MAX);
  uint8_t* m = allocT<uint8_t>(size + nullTerminate);
  if (ASMJIT_UNLIKELY(!m)) return nullptr;

  memcpy(m, data, size);
  if (nullTerminate) m[size] = '\0';

  return static_cast<void*>(m);
}